

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::Statement(Statement *this,Database *aDatabase,string *aQuery)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  string *aQuery_local;
  Database *aDatabase_local;
  Statement *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)aQuery);
  Ptr::Ptr(&this->mStmtPtr,aDatabase->mpSQLite,&this->mQuery);
  this->mColumnCount = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mColumnNames);
  this->mbHasRow = false;
  this->mbDone = false;
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  iVar1 = sqlite3_column_count(pStmt);
  this->mColumnCount = iVar1;
  return;
}

Assistant:

Statement::Statement(Database &aDatabase, const std::string& aQuery) :
    mQuery(aQuery),
    mStmtPtr(aDatabase.mpSQLite, mQuery), // prepare the SQL query, and ref count (needs Database friendship)
    mColumnCount(0),
    mbHasRow(false),
    mbDone(false)
{
    mColumnCount = sqlite3_column_count(mStmtPtr);
}